

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFusage.c
# Opt level: O1

uint64_t dissect_and_calculate(NF_list *nl)

{
  NF_link_map *pNVar1;
  char *pcVar2;
  ushort uVar3;
  int iVar4;
  int *__buf;
  char **ppcVar5;
  NF_link_map **ppNVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  NF_list *pNVar10;
  NF_link_map *pNVar11;
  long *plVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  long lVar16;
  long *unaff_RBP;
  Elf64_Phdr *ph;
  uint uVar17;
  long *__size;
  bool bVar18;
  filebuf fb;
  long *local_3a0;
  char local_378 [40];
  Elf64_Addr local_350;
  ushort local_338;
  
  pNVar1 = nl->map;
  __size = (long *)pNVar1->l_phlen;
  __buf = (int *)malloc((size_t)__size);
  pread(nl->fd,__buf,(size_t)__size,pNVar1->l_phoff);
  if ((ulong)pNVar1->l_phnum == 0) {
    local_3a0 = (long *)0x1000;
  }
  else {
    piVar15 = __buf + (ulong)pNVar1->l_phnum * 0xe;
    do {
      if (*__buf == 2) {
        sVar8 = *(size_t *)(__buf + 10);
        unaff_RBP = (long *)malloc(sVar8);
        pread(nl->fd,unaff_RBP,sVar8,*(__off_t *)(__buf + 2));
      }
      else if (*__buf == 1) {
        __size = (long *)(*(long *)(__buf + 10) + *(long *)(__buf + 4));
      }
      __buf = __buf + 0xe;
    } while (__buf < piVar15);
    __size = (long *)(((ulong)__size & 0xfffffffffffff000) + 0x1000);
    local_3a0 = __size;
  }
  iVar14 = 0;
  iVar4 = 0;
  plVar12 = unaff_RBP;
  do {
    lVar16 = *plVar12;
    if (lVar16 < 5) {
      if (lVar16 == 1) {
        iVar14 = iVar14 + 1;
      }
      else if (lVar16 == 0) {
        ppcVar5 = (char **)malloc((long)iVar4 << 3);
        pNVar1->l_runpath = ppcVar5;
        ppNVar6 = (NF_link_map **)calloc((long)(iVar14 + 2),8);
        pNVar1->l_search_list = ppNVar6;
        plVar12 = unaff_RBP + 1;
        iVar4 = 0;
        do {
          if (plVar12[-1] == 0x1d) {
            pcVar7 = (char *)malloc(0x40);
            pread(nl->fd,pcVar7,0x40,*plVar12 + __size[1]);
            pNVar1->l_runpath[iVar4] = pcVar7;
            iVar4 = iVar4 + 1;
          }
          else if (plVar12[-1] == 0) {
            uVar17 = 0;
            do {
              if (*unaff_RBP == 1) {
                lVar16 = unaff_RBP[1];
                pcVar7 = (char *)malloc(0x80);
                pread(nl->fd,pcVar7,0x80,lVar16 + __size[1]);
                uVar17 = 0;
                for (pNVar10 = head; pNVar10 != (NF_list *)0x0; pNVar10 = pNVar10->next) {
                  pNVar11 = pNVar10->map;
                  iVar14 = strcmp(pcVar7,pNVar11->l_name);
                  if (iVar14 == 0) {
                    *nl->map->l_search_list = pNVar11;
                    uVar17 = 1;
                    break;
                  }
                }
                if (pNVar10 == (NF_list *)0x0) {
                  iVar14 = open(pcVar7,0);
                  if (iVar14 == -1) {
                    if (iVar4 < 1) {
                      iVar14 = -1;
                    }
                    else {
                      lVar16 = 1;
                      do {
                        pcVar2 = pNVar1->l_runpath[lVar16 + -1];
                        sVar8 = strlen(pcVar2);
                        memcpy(local_378,pcVar2,sVar8);
                        local_378[sVar8] = '/';
                        sVar9 = strlen(pcVar7);
                        memcpy(local_378 + sVar8 + 1,pcVar7,sVar9 + 1);
                        iVar14 = open(local_378,0);
                        if (iVar14 != -1) break;
                        bVar18 = lVar16 < iVar4;
                        lVar16 = lVar16 + 1;
                      } while (bVar18);
                    }
                    if (iVar14 == -1) {
                      lVar16 = 0;
                      do {
                        pcVar2 = *(char **)((long)sys_path + lVar16);
                        sVar8 = strlen(pcVar2);
                        memcpy(local_378,pcVar2,sVar8);
                        sVar9 = strlen(pcVar7);
                        memcpy(local_378 + sVar8,pcVar7,sVar9 + 1);
                        iVar14 = open(local_378,0);
                        if (iVar14 != -1) break;
                        bVar18 = lVar16 == 0;
                        lVar16 = lVar16 + 8;
                      } while (bVar18);
                      if (iVar14 == -1) {
                        printf("In mapping %s as a dependency: file not found\n",pcVar7);
                        iVar14 = -1;
                      }
                    }
                  }
                  pNVar10 = (NF_list *)calloc(0x20,1);
                  tail->next = pNVar10;
                  pNVar10->next = (NF_list *)0x0;
                  local_378[0] = '\0';
                  local_378[1] = '\0';
                  local_378[2] = '\0';
                  local_378[3] = '\0';
                  local_378[4] = '\0';
                  local_378[5] = '\0';
                  local_378[6] = '\0';
                  local_378[7] = '\0';
                  tail = pNVar10;
                  read(iVar14,local_378 + 8,0x340);
                  uVar3 = local_338;
                  uVar13 = (ulong)local_338;
                  pNVar11 = (NF_link_map *)calloc(0x298,1);
                  pNVar10->map = pNVar11;
                  pNVar10->fd = iVar14;
                  pcVar7 = strdup(pcVar7);
                  pNVar11->l_name = pcVar7;
                  pNVar11->l_phnum = uVar3;
                  pNVar11->l_phlen = uVar13 * 0x38;
                  pNVar11->l_phoff = local_350;
                  uVar13 = (ulong)uVar17;
                  uVar17 = uVar17 + 1;
                  pNVar1->l_search_list[uVar13] = pNVar11;
                }
              }
              else if (*unaff_RBP == 0) {
                pNVar1->l_search_list[uVar17] = pNVar1;
                nl->len = (Elf64_Addr)local_3a0;
                return (uint64_t)local_3a0;
              }
              unaff_RBP = unaff_RBP + 2;
            } while( true );
          }
          plVar12 = plVar12 + 2;
        } while( true );
      }
    }
    else if (lVar16 == 0x1d) {
      iVar4 = iVar4 + 1;
    }
    else if (lVar16 == 5) {
      __size = plVar12;
    }
    plVar12 = plVar12 + 2;
  } while( true );
}

Assistant:

uint64_t dissect_and_calculate(struct NF_list *nl)
{
    /* this function examine ``nl`` on the list, and put its dependencies on the list */
    //fb.buf is used as a pointer to ELF header, later we will do this again in building up the link_map
    struct NF_link_map *l = nl->map;
    Elf64_Phdr *phdr = malloc(l->l_phlen);
    pread(nl->fd, (void *)phdr, l->l_phlen, l->l_phoff);
    uint16_t phnum = l->l_phnum;

    Elf64_Dyn *ld;
    Elf64_Addr mapstart = -1, mapend;

    /* now dealing with the program headers, from which we need to 
       access the PT_LOAD for memory it takes up, and 
       PT_DYNAMIC for the contents of .dynamic */
    for (Elf64_Phdr *ph = phdr; ph < &phdr[phnum]; ++ph)
    {
        if (ph->p_type == PT_LOAD)
        {
            if (mapstart < 0)
                mapstart = ALIGN_DOWN(ph->p_vaddr, 4096);
            mapend = ph->p_vaddr + ph->p_memsz;
        }
        else if (ph->p_type == PT_DYNAMIC)
        {
            ld = malloc(ph->p_memsz);
            /* though it is not the same time, but it is the same fd... */
            pread(nl->fd, (void *)ld, ph->p_memsz, ph->p_offset); //note that offset and paddr are not the same
        }
    }

    Elf64_Dyn *str, *dyn = ld, *curr = ld;
    int nrunp = 0, nneeded = 0;

    while (curr->d_tag != DT_NULL)
    {
        switch (curr->d_tag)
        {
        case DT_STRTAB:
            str = curr;
            break;
        case DT_NEEDED:
            nneeded++;
            break;
        case DT_RUNPATH:
            nrunp++;
            break;
        }
        curr++;
    }
    l->l_runpath = (const char **)malloc(nrunp * sizeof(char *));
    l->l_search_list = (struct NF_link_map **)calloc(nneeded + 2, sizeof(struct NF_link_map *));
    int runpcnt = 0;
    int neededcnt = 0; //again, this is for filling the search list

    while (dyn->d_tag != DT_NULL)
    {
        if (dyn->d_tag == DT_RUNPATH)
        {
            char *tmp_name = malloc(64);
            pread(nl->fd, tmp_name, 64, str->d_un.d_ptr + dyn->d_un.d_val);
            l->l_runpath[runpcnt] = tmp_name;
            runpcnt++;
        }
        dyn++;
    }

    dyn = ld;
    while (dyn->d_tag != DT_NULL)
    {
        if (dyn->d_tag == DT_NEEDED)
        {
            neededcnt = 0; //neededcnt is DT_NEEDED-wise
            Elf64_Addr offset = dyn->d_un.d_val;
            char *filename = malloc(128);                           //store the filename for each dependency
            pread(nl->fd, filename, 128, str->d_un.d_ptr + offset); //change from 64 to 128 because the prefix is long
            struct NF_list *tmp = head;
            int found = 0;
            while (tmp != NULL)
            {
                if (!strcmp(filename, tmp->map->l_name))
                {
                    found = 1;
                    nl->map->l_search_list[neededcnt++] = tmp->map;
                    break;
                }
                tmp = tmp->next;
            }
            if (!found)
            {
                int fd = open(filename, O_RDONLY);
                /* XXX problems here
                 * open will successfully deal with file under the current directory
                 * but dlopen won't until RUNPATH is set
                 */
                if (fd == -1)
                {
                    //XXX: THIS IS NOT REALLY USEABLE NOW, PLZ ADD RUNPATH SUPPORT
                    //only lib1.so -> lib2.so -> lib3.so will work now ... and no libc func can be used

                    char buf[128];
                    for (int i = 0; i < runpcnt; i++)
                    {
                        char *ptr = mempcpy(buf, l->l_runpath[i], strlen(l->l_runpath[i]));
                        *ptr = '/'; //add a "/" to make it a path
                        ptr++;
                        memcpy(ptr, filename, strlen(filename) + 1); //+1 to copy \0. memcpy only copy num bytes
                        if ((fd = open(buf, O_RDONLY)) != -1)
                            break;
                    }
                    //nothing found in runpath, now try system path
                    if (fd == -1)
                    {
                        for (int i = 0; i < 2; i++)
                        {
                            char *ptr = mempcpy(buf, sys_path[i], strlen(sys_path[i]));
                            memcpy(ptr, filename, strlen(filename) + 1);
                            if ((fd = open(buf, O_RDONLY)) != -1)
                                break;
                        }
                        if (fd == -1)
                            printf("In mapping %s as a dependency: file not found\n", filename);
                    }
                }
                struct NF_list *tmp = calloc(sizeof(struct NF_list), 1);
                //reset the pointers to fit a new element
                tail->next = tmp;
                tmp->next = NULL;
                tail = tmp; //set tail to be the last unique element
                /* filling the info all over again */
                struct filebuf fb;
                fb.len = 0;
                size_t retlen = read(fd, fb.buf, sizeof(fb.buf) - fb.len);
                Elf64_Ehdr *ehdr = (Elf64_Ehdr *)fb.buf;
                Elf64_Addr maplength = ehdr->e_phnum * sizeof(Elf64_Phdr);

                tmp->map = calloc(sizeof(struct NF_link_map), 1);
                tmp->fd = fd;
                char *real_name = strdup(filename); //don't forget to free it when destroying a link_map!
                tmp->map->l_name = real_name;
                tmp->map->l_phnum = ehdr->e_phnum;
                tmp->map->l_phlen = maplength;
                tmp->map->l_phoff = ehdr->e_phoff;
                l->l_search_list[neededcnt++] = tmp->map;
            }
        }
        dyn++;
    }
    l->l_search_list[neededcnt] = l; //quick fix for global variables to relocate

    nl->len = ALIGN_UP(mapend - mapstart, 4096); //use this to get the exact location for next so if we want it compact
    return ALIGN_UP(mapend - mapstart, 4096);
}